

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_rng.hpp
# Opt level: O2

void __thiscall boost::uuids::detail::seed_rng::sha1_random_digest_(seed_rng *this)

{
  __pid_t _Var1;
  uint uVar2;
  uchar *b_5;
  uchar *b;
  int i;
  long lVar3;
  uchar *b_2;
  uint digest [5];
  undefined1 local_c4 [12];
  uint *ps;
  seed_rng *this_ptr;
  sha1 local_a8;
  
  local_a8.h_[0] = 0x67452301;
  local_a8.h_[1] = 0xefcdab89;
  local_a8.h_[2] = 0x98badcfe;
  local_a8.h_[3] = 0x10325476;
  local_a8.h_[4] = 0xc3d2e1f0;
  local_a8.bit_count_high = 0;
  local_a8.block_byte_index_ = 0;
  local_a8.bit_count_low = 0;
  if ((FILE *)this->random_ != (FILE *)0x0) {
    fread(digest,1,0x14,(FILE *)this->random_);
    sha1::process_block(&local_a8,digest,local_c4);
  }
  _Var1 = getpid();
  ps = (uint *)CONCAT44(ps._4_4_,_Var1);
  sha1::process_block(&local_a8,&ps,(void *)((long)&ps + 4));
  gettimeofday((timeval *)digest,(__timezone_ptr_t)0x0);
  sha1::process_block(&local_a8,digest,digest + 4);
  ps = &sha1_random_digest_state_()::state;
  sha1::process_block(&local_a8,&sha1_random_digest_state_()::state,&DAT_0012a4b4);
  sha1::process_block(&local_a8,&ps,&this_ptr);
  digest._0_8_ = clock();
  sha1::process_block(&local_a8,digest,digest + 2);
  uVar2 = rand();
  digest[0] = uVar2;
  uVar2 = rand();
  digest[1] = uVar2;
  digest[2] = rand();
  sha1::process_block(&local_a8,digest,digest + 3);
  digest._0_8_ = operator_new(4);
  sha1::process_block(&local_a8,digest,digest + 2);
  operator_delete((void *)digest._0_8_,4);
  this_ptr = this;
  sha1::process_block(&local_a8,&this_ptr,&local_a8);
  sha1::process_block(&local_a8,this,&this->rd_index_);
  sha1::get_digest(&local_a8,&digest);
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    ps[lVar3] = ps[lVar3] ^ digest[lVar3];
    this->rd_[lVar3] = this->rd_[lVar3] ^ digest[lVar3];
  }
  return;
}

Assistant:

void sha1_random_digest_()
    {
        boost::uuids::detail::sha1 sha;


        if (random_)
        {
            // intentionally left uninitialized
            unsigned char state[ 20 ];
#if defined(BOOST_WINDOWS)
            boost::winapi::CryptGenRandom(random_, sizeof(state), state);
#else
            ignore_size(std::fread( state, 1, sizeof(state), random_ ));
#endif
            sha.process_bytes( state, sizeof( state ) );
        }

        {
            // Getting enropy from some system specific sources
#if defined(BOOST_WINDOWS)
            boost::winapi::DWORD_ procid = boost::winapi::GetCurrentProcessId();
            sha.process_bytes( (unsigned char const*)&procid, sizeof( procid ) );

            boost::winapi::DWORD_ threadid = boost::winapi::GetCurrentThreadId();
            sha.process_bytes( (unsigned char const*)&threadid, sizeof( threadid ) );

            boost::winapi::LARGE_INTEGER_ ts;
            ts.QuadPart = 0;
            boost::winapi::QueryPerformanceCounter( &ts );
            sha.process_bytes( (unsigned char const*)&ts, sizeof( ts ) );

            std::time_t tm = std::time( 0 );
            sha.process_bytes( (unsigned char const*)&tm, sizeof( tm ) );
#else
            pid_t pid = getpid();
            sha.process_bytes( (unsigned char const*)&pid, sizeof( pid ) );

            timeval ts;
            gettimeofday(&ts, NULL); // We do not use `clock_gettime` to avoid linkage with -lrt
            sha.process_bytes( (unsigned char const*)&ts, sizeof( ts ) );
#endif
        }


        unsigned int * ps = sha1_random_digest_state_();
        sha.process_bytes( ps, internal_state_size * sizeof( unsigned int ) );
        sha.process_bytes( (unsigned char const*)&ps, sizeof( ps ) );

        {
            std::clock_t ck = std::clock();
            sha.process_bytes( (unsigned char const*)&ck, sizeof( ck ) );
        }

        {
            unsigned int rn[] =
                { static_cast<unsigned int>(std::rand())
                , static_cast<unsigned int>(std::rand())
                , static_cast<unsigned int>(std::rand())
                };
            sha.process_bytes( (unsigned char const*)rn, sizeof( rn ) );
        }

        {
            unsigned int * p = new unsigned int;
            sha.process_bytes( (unsigned char const*)&p, sizeof( p ) );
            delete p;

            const seed_rng* this_ptr = this;
            sha.process_bytes( (unsigned char const*)&this_ptr, sizeof( this_ptr ) );
        }

        sha.process_bytes( (unsigned char const*)rd_, sizeof( rd_ ) );

        unsigned int digest[ 5 ];
        sha.get_digest( digest );

        for( int i = 0; i < 5; ++i )
        {
            // harmless data race
            ps[ i ] ^= digest[ i ];
            rd_[ i ] ^= digest[ i ];
        }
    }